

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_sdl2.cpp
# Opt level: O1

void ImGui_ImplSDL2_UpdateGamepadAnalog
               (ImGui_ImplSDL2_Data *bd,ImGuiIO *io,ImGuiKey key,SDL_GameControllerAxis axis_no,
               float v0,float v1)

{
  _SDL_GameController **pp_Var1;
  short sVar2;
  long lVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  lVar4 = (long)(bd->Gamepads).Size;
  if (lVar4 == 0) {
    fVar6 = 0.0;
  }
  else {
    pp_Var1 = (bd->Gamepads).Data;
    lVar3 = 0;
    fVar7 = 0.0;
    do {
      sVar2 = SDL_GameControllerGetAxis(*(undefined8 *)((long)pp_Var1 + lVar3),axis_no);
      fVar5 = ((float)(int)sVar2 - v0) / (v1 - v0);
      fVar6 = 1.0;
      if (fVar5 <= 1.0) {
        fVar6 = fVar5;
      }
      fVar6 = (float)(~-(uint)(fVar5 < 0.0) & (uint)fVar6);
      if (fVar6 <= fVar7) {
        fVar6 = fVar7;
      }
      lVar3 = lVar3 + 8;
      fVar7 = fVar6;
    } while (lVar4 * 8 != lVar3);
  }
  ImGuiIO::AddKeyAnalogEvent(io,key,0.1 < fVar6,fVar6);
  return;
}

Assistant:

static void ImGui_ImplSDL2_UpdateGamepadAnalog(ImGui_ImplSDL2_Data* bd, ImGuiIO& io, ImGuiKey key, SDL_GameControllerAxis axis_no, float v0, float v1)
{
    float merged_value = 0.0f;
    for (SDL_GameController* gamepad : bd->Gamepads)
    {
        float vn = Saturate((float)(SDL_GameControllerGetAxis(gamepad, axis_no) - v0) / (float)(v1 - v0));
        if (merged_value < vn)
            merged_value = vn;
    }
    io.AddKeyAnalogEvent(key, merged_value > 0.1f, merged_value);
}